

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

LogDestination * google::LogDestination::log_destination(LogSeverity severity)

{
  LogDestination *this;
  bool local_1d;
  LogSeverity severity_local;
  
  local_1d = 3 < (uint)severity;
  if (local_1d) {
    __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                  ,0x32d,
                  "static LogDestination *google::LogDestination::log_destination(LogSeverity)");
  }
  if (*(long *)(log_destinations_ + (long)severity * 8) == 0) {
    this = (LogDestination *)operator_new(0xe0);
    LogDestination(this,severity,(char *)0x0);
    *(LogDestination **)(log_destinations_ + (long)severity * 8) = this;
  }
  return *(LogDestination **)(log_destinations_ + (long)severity * 8);
}

Assistant:

inline LogDestination* LogDestination::log_destination(LogSeverity severity) {
  assert(severity >=0 && severity < NUM_SEVERITIES);
  if (!log_destinations_[severity]) {
    log_destinations_[severity] = new LogDestination(severity, NULL);
  }
  return log_destinations_[severity];
}